

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

int zip_archive_truncate(mz_zip_archive *pzip)

{
  mz_zip_internal_state *pmVar1;
  mz_uint64 mVar2;
  int __fd;
  int fd;
  mz_uint64 file_size;
  mz_zip_internal_state *pState;
  mz_zip_archive *pzip_local;
  
  pmVar1 = pzip->m_pState;
  mVar2 = pzip->m_archive_size;
  if ((pzip->m_pWrite == mz_zip_heap_write_func) && (pmVar1->m_pMem != (void *)0x0)) {
    pzip_local._4_4_ = 0;
  }
  else if ((pzip->m_zip_mode == MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED) &&
          (pmVar1->m_pFile != (FILE *)0x0)) {
    __fd = fileno((FILE *)pmVar1->m_pFile);
    pzip_local._4_4_ = ftruncate(__fd,pmVar1->m_file_archive_start_ofs + mVar2);
  }
  else {
    pzip_local._4_4_ = 0;
  }
  return pzip_local._4_4_;
}

Assistant:

static int zip_archive_truncate(mz_zip_archive *pzip) {
  mz_zip_internal_state *pState = pzip->m_pState;
  mz_uint64 file_size = pzip->m_archive_size;
  if ((pzip->m_pWrite == mz_zip_heap_write_func) && (pState->m_pMem)) {
    return 0;
  }
  if (pzip->m_zip_mode == MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED) {
    if (pState->m_pFile) {
      int fd = fileno(pState->m_pFile);
      return ftruncate(fd, pState->m_file_archive_start_ofs + file_size);
    }
  }
  return 0;
}